

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O1

void __thiscall dlib::error::error(error *this,error_type t,string *a)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__error_001fb258;
  (this->info)._M_dataplus._M_p = (pointer)&(this->info).field_2;
  pcVar1 = (a->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->info,pcVar1,pcVar1 + a->_M_string_length);
  this->type = t;
  return;
}

Assistant:

error(
            error_type t,
            const std::string& a
        ): info(a), type(t) {}